

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cc
# Opt level: O2

bool __thiscall dh::scanner::scan(scanner *this,FILE *fp)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  char cVar5;
  string tmp;
  allocator local_260 [44];
  int local_234;
  
  destroy(this);
  std::__cxx11::string::string((string *)&tmp,"",local_260);
  if (fp != (FILE *)0x0) {
    do {
      do {
        uVar1 = fgetc((FILE *)fp);
      } while ((char)uVar1 == '\t');
    } while ((uVar1 & 0xff) == 0x20);
    uVar4 = 0;
    while( true ) {
      uVar2 = uVar1;
      local_234 = uVar4 + 0x3d;
      bVar3 = (byte)uVar2;
      if (bVar3 == 0xff) break;
      if (bVar3 == 10 && (char)uVar4 != '\r' || bVar3 == 0xd) {
        this->line = this->line + 1;
      }
      uVar1 = uVar2 & 0xff;
      if ((0x20 < bVar3) || ((0x100002600U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) {
        cVar5 = (char)&tmp;
        if ((uVar1 == 0x5f) || ((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a)) {
          std::__cxx11::string::push_back(cVar5);
        }
        else if ((byte)(bVar3 - 0x30) < 10) {
          std::__cxx11::string::push_back(cVar5);
        }
        else if (bVar3 == 0x2e) {
          std::__cxx11::string::push_back(cVar5);
        }
        else if (uVar1 == 0x22) {
          std::__cxx11::string::push_back(cVar5);
        }
      }
      uVar1 = fgetc((FILE *)fp);
      uVar4 = uVar2;
    }
    (this->_it)._M_current =
         (this->_tokens).super__Vector_base<dh::token,_std::allocator<dh::token>_>._M_impl.
         super__Vector_impl_data._M_start;
    this->scanflag = true;
    fclose((FILE *)fp);
  }
  std::__cxx11::string::~string((string *)&tmp);
  return fp != (FILE *)0x0;
}

Assistant:

bool scanner::scan(::std::FILE *fp)
{
	this->reset();

	STATE state = STATE::START;
	char cur = 0;
	char lastch = 0;
	::std::string tmp = "";

	if ( fp == NULL)
	{
		return false;
	}

	cur = ::std::fgetc(fp);
	while( cur == ' ' || cur == '\t') cur = ::std::fgetc(fp);

	// DFA implement
	while( cur != EOF)
	{
		if ( cur == '\n' && lastch != '\r')
		{
			++line;
		} else if ( cur == '\r')
		{
			++line;
		}

		// core part
		switch(state)
		{
			case STATE::START:
				if ( cur == ' ' || cur == '\t'
						|| cur == '\r' || cur == '\n')
				{
					state = STATE::START;
				} else if ( cur == '_' 
						|| ( cur >= 'a' && cur <= 'z')
						|| ( cur >= 'A' && cur <= 'Z'))
				{
					state = STATE::INID;
					tmp += cur;
				} else if ( cur >= '0' && cur <= '9')
				{
					state = STATE::ININT;
					tmp += cur;
				} else if ( cur == '\"') 
				{
					state = STATE::INSTRING;
					tmp += cur;
				} else if ( cur == '.') 
				{
					state = STATE::INFLOAT;
					tmp += cur;
				}
				else 
				{
					state = STATE::DONE;
				}
				lastch = cur;
				break;
			case INID:
				if ( cur == '_'
						|| ( cur >= 'a' && cur <= 'z')
						|| ( cur >= 'A' && cur <= 'Z')
						|| ( cur >= '0' && cur <= '9'))
				{
					state = STATE::INID;
					tmp += cur;
				} else 
				{
					state = STATE::DONE;
					
					TYPE tmp_type = TYPE::ID;
					if ( tmp == "boolean")
					{
						tmp_type = TYPE::BOOLEAN;
					} else if ( tmp == "break")
					{
						tmp_type = TYPE::BREAK;
					} else if ( tmp == "continue")
					{
						tmp_type = TYPE::CONTINUE;
					} else if ( tmp == "else")
					{
						tmp_type = TYPE::ELSE;
					} else if ( tmp == "for")
					{
						tmp_type = TYPE::FOR;
					} else if ( tmp == "float")
					{
						tmp_type = TYPE::FLOAT;
					} else if ( tmp == "if")
					{
						tmp_type = TYPE::IF;
					} else if ( tmp == "int")
					{
						tmp_type = TYPE::INT;
					} else if ( tmp == "return")
					{
						tmp_type = TYPE::RETURN;
					} else if ( tmp == "void")
					{
						tmp_type = TYPE::VOID;
					} else if ( tmp == "while")
					{
						tmp_type = TYPE::WHILE;
					} else if ( tmp == "true" || tmp == "false")
					{
						tmp_type = TYPE::NUMBOOLEAN;
					} else 
					{
						tmp_type = TYPE::ID;
					}
					_tokens.push_back( token( tmp, tmp_type, line));
					tmp.clear();
				}
				lastch = cur;
				break;
			case STATE::ININT:
				if ( cur >= '0' && cur <= '9')
				{
					tmp += cur;
					state = STATE::ININT;
				} else if ( cur == '.')
				{
					state = STATE::INFLOAT;
					tmp += cur;
				} else if ( cur == 'E' || cur == 'e')
				{
					tmp += cur;
					state = STATE::INFLOAT;
				} else 
				{
					state = STATE::DONE;
					
					_tokens.push_back( token( tmp, TYPE::NUMINT, line));
					tmp.clear();
				}
				lastch = cur;
				break;
			case STATE::INFLOAT:
				if ( lastch == '.')
				{
					if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else 
					{
						state = STATE::DONE;

						_tokens.push_back( token( tmp, TYPE::NUMFLOAT, line));
						tmp.clear();
					}
				} else if ( lastch == 'E' || lastch == 'e')
				{
					if ( cur == '+' || cur == '-')
					{
						state = STATE::INFLOAT;
						tmp += cur;
					} else if ( cur >= '0' && cur <= '9')
					{
						state = STATE::INFLOAT;
						tmp += cur;
					} else 
					{
						state = STATE::START;
						::std::cerr << "[ERROR] Incompleted float-literal \"" 
							<< tmp
							<< "\" near line " 
							<< line << ::std::endl;
						tmp.clear();
						rightflag = false;
					}
				} else if( lastch >= '0' && lastch <= '9')
				{
					if ( cur == 'E' || cur == 'e')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else
					{
						state = STATE::DONE;
						_tokens.push_back( token( tmp, TYPE::NUMFLOAT, line));
						tmp.clear();
					}
				} else if ( lastch == '+' || lastch == '-')
				{
					if ( cur >= '0' && cur <= '9')
					{
						tmp += cur;
						state = STATE::INFLOAT;
					} else 
					{
						::std::cerr << "[ERROR] Incompleted float-literal \""
							<< tmp
							<< "\" near line "
							<< line
							<< ::std::endl;
						tmp.clear();
						rightflag = false;
						state = STATE::START;
					}
				}
				lastch = cur;
				break;
			case STATE::INMULTICOMMENT:
				if ( lastch == '*' && cur == '/')
				{
					state = STATE::START;
				} else 
				{
					state = STATE::INMULTICOMMENT;
				}
				lastch = cur;
				break;
			case STATE::INSINGLECOMMENT:
				if (cur == '\r' || cur == '\n')
				{
					state = STATE::START;
				} else 
				{
					state = STATE::INSINGLECOMMENT;
				}
				lastch = cur;
				break;
			case STATE::INSTRING:
				if ( cur == '\"' && lastch != '\\')
				{
					state = STATE::START;

					_tokens.push_back( token( tmp, TYPE::STRING, line));
					tmp.clear();
				} else 
				{
					state = STATE::INSTRING;
					if ( cur != '\n' && cur != '\r')
					{
						tmp += cur;
					}
				}
				lastch = cur;
				break;
			case STATE::DONE:
				switch(lastch)
				{
					case ' ':
					case '\t':
					case '\r':
					case '\n':
						break;
					case '=':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = lastch + cur;

							_tokens.push_back( token( tmp, TYPE::EQUOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::ASSINGOP, line));
							tmp.clear();
						}
						break;
					case '!':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = "!=";

							_tokens.push_back( token( tmp, TYPE::EQUOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();
						}
						break;
					case '>':
					case '<':
						if ( cur == '=')
						{
							tmp.clear();
							tmp = lastch + cur;

							_tokens.push_back( token( tmp, TYPE::RELOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							tmp = lastch;

							_tokens.push_back( token( tmp, TYPE::RELOP, line));
							tmp.clear();
						}
						break;
					case '|':
						if ( cur == '|')
						{
							tmp.clear();
							tmp = "||";

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							::std::cerr << "[ERROR] Incompleted Logical operator \"|\""
								<< " near line " 
								<< line
								<< ::std::endl;
							rightflag = false;
						}
						break;
					case '&':
						if ( cur == '&')
						{
							tmp.clear();
							tmp = "&&";

							_tokens.push_back( token( tmp, TYPE::LOGICALOP, line));
							tmp.clear();

							cur = ::std::fgetc(fp);
						} else 
						{
							tmp.clear();
							::std::cerr << "[ERROR] Incompleted Logical operator \"&\""
								<< " near line " 
								<< line
								<< ::std::endl;
							rightflag = false;
						}
						break;
					case '/':
						if ( cur == '/')
						{
							state = STATE::INSINGLECOMMENT;
							continue;
						} else if ( cur == '*'){
							state = STATE::INMULTICOMMENT;
							continue;
						}
					case '*':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::MULOP, line));
						tmp.clear();
						break;
					case '+':
					case '-':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::ADDOP, line));
						tmp.clear();
						break;
					case '{':
					case '}':
					case '[':
					case ']':
					case '(':
					case ')':
					case ',':
					case ';':
						tmp.clear();
						tmp = lastch;
						_tokens.push_back( token( tmp, TYPE::SEPOP, line));
						tmp.clear();
						break;
					default:
						::std::cerr << "[ERROR] Unexpected Token \""
							<< lastch
							<< "\" in line "
							<< line
							<< ::std::endl;
						rightflag = false;
						break;
				}
				if (cur == '\n' || cur == '\r')
				{
					--line;
				}
				state = STATE::START;
				continue;
		}
		cur = ::std::fgetc(fp);
	}
	_it = _tokens.begin();
	scanflag = true;;
	fclose(fp);
	return true;
}